

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter_test.cpp
# Opt level: O2

void __thiscall
InterpreterTestSuite_MNSV_AllOtherDifferWithCurrentSelected_Test::
InterpreterTestSuite_MNSV_AllOtherDifferWithCurrentSelected_Test
          (InterpreterTestSuite_MNSV_AllOtherDifferWithCurrentSelected_Test *this)

{
  InterpreterTestSuite::InterpreterTestSuite(&this->super_InterpreterTestSuite);
  (this->super_InterpreterTestSuite).super_Test._vptr_Test = (_func_int **)&PTR__Test_0033b6c0;
  return;
}

Assistant:

TEST_F(InterpreterTestSuite, MNSV_AllOtherDifferWithCurrentSelected)
{
    TestContext ctx;
    InitContext(ctx);
    ASSERT_EQ(
        ctx.mRegistry->Add(BorderAgent{"127.0.0.1", 20001, ByteArray{}, "1.1", BorderAgent::State{0, 0, 0, 0, 0},
                                       "net1", 1, "", "", Timestamp{0, 0, 0}, 0, "", ByteArray{}, "domain1", 0, 0, "",
                                       0, 0x1F | BorderAgent::kDomainNameBit | BorderAgent::kExtendedPanIdBit}),
        RegistryStatus::kSuccess);
    ASSERT_EQ(
        ctx.mRegistry->Add(BorderAgent{"127.0.0.2", 20001, ByteArray{}, "1.1", BorderAgent::State{0, 0, 0, 0, 0},
                                       "net2", 2, "", "", Timestamp{0, 0, 0}, 0, "", ByteArray{}, "domain1", 0, 0, "",
                                       0, 0x1F | BorderAgent::kDomainNameBit | BorderAgent::kExtendedPanIdBit}),
        RegistryStatus::kSuccess);
    BorderRouter br;
    br.mNetworkId = NetworkId{0};
    ASSERT_EQ(ctx.mRegistry->SetCurrentNetwork(br), RegistryStatus::kSuccess);

    Interpreter::Expression expr, ret;
    std::vector<uint64_t>   nids;
    expr = ctx.mInterpreter.ParseExpression("start --nwk all");
    EXPECT_EQ(ctx.mInterpreter.ReParseMultiNetworkSyntax(expr, ret).GetCode(), ErrorCode::kNone);
    EXPECT_TRUE(ctx.mInterpreter.ValidateMultiNetworkSyntax(ret, nids).HasNoError());
    EXPECT_NE(std::find(nids.begin(), nids.end(), 1), nids.end());
    EXPECT_NE(std::find(nids.begin(), nids.end(), 2), nids.end());
    ctx.mInterpreter.mContext.Cleanup();
    ctx.mInterpreter.mJobManager->CleanupJobs();
    ret.clear();
    nids.clear();

    expr = ctx.mInterpreter.ParseExpression("start --nwk other");
    EXPECT_EQ(ctx.mInterpreter.ReParseMultiNetworkSyntax(expr, ret).GetCode(), ErrorCode::kNone);
    EXPECT_TRUE(ctx.mInterpreter.ValidateMultiNetworkSyntax(ret, nids).HasNoError());
    EXPECT_EQ(std::find(nids.begin(), nids.end(), 1), nids.end());
    EXPECT_NE(std::find(nids.begin(), nids.end(), 2), nids.end());
    ctx.mInterpreter.mContext.Cleanup();
    ctx.mInterpreter.mJobManager->CleanupJobs();
    ret.clear();
    nids.clear();
}